

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

iuIParamGenerator<int> * __thiscall
iutest::detail::iuConcatParamHolder::operator_cast_to_iuIParamGenerator_(iuConcatParamHolder *this)

{
  iuValuesInParamsGenerator<int> *this_00;
  params_t<int> params;
  
  params.val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  params.val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  params.val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iuConcatParamHolder<iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuParamGenerator<int>_>
  ::params_t<int>::append<bool>(&params,(iuParamGenerator<bool> *)this);
  iuConcatParamHolder<iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuParamGenerator<int>_>
  ::params_t<int>::append<int>(&params,(iuParamGenerator<int> *)(this + 0x10));
  this_00 = (iuValuesInParamsGenerator<int> *)operator_new(0x28);
  iuValuesInParamsGenerator<int>::iuValuesInParamsGenerator(this_00,&params.val);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&params);
  return &this_00->super_iuIParamGenerator<int>;
}

Assistant:

operator iuIParamGenerator<T>* ()
    {
        params_t<T> params;
        params.append(m_g1);
        params.append(m_g2);
        return new iuValuesInParamsGenerator<T>(params.val);
    }